

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_maximum_likelihood_parameter_generation.cc
# Opt level: O0

bool __thiscall
sptk::NonrecursiveMaximumLikelihoodParameterGeneration::Run
          (NonrecursiveMaximumLikelihoodParameterGeneration *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *variance_vectors,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *smoothed_static_parameters)

{
  bool bVar1;
  size_type sVar2;
  SymmetricMatrix *this_00;
  const_reference this_01;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RDX;
  long in_RDI;
  int t;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> covariance_matrices;
  int sequence_length;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000520;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *in_stack_00000528;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_00000530;
  NonrecursiveMaximumLikelihoodParameterGeneration *in_stack_00000538;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  allocator_type *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *this_02;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int iVar3;
  undefined4 in_stack_ffffffffffffff64;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> local_88 [2];
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> local_48;
  int local_2c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_20;
  bool local_1;
  
  if ((*(byte *)(in_RDI + 0x38) & 1) != 0) {
    local_20 = in_RDX;
    bVar1 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::empty((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    if (!bVar1) {
      sVar2 = std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::size(local_20);
      local_2c = (int)sVar2;
      this_00 = (SymmetricMatrix *)(long)local_2c;
      this_01 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](local_20,0);
      std::vector<double,_std::allocator<double>_>::size(this_01);
      this_02 = local_88;
      SymmetricMatrix::SymmetricMatrix
                ((SymmetricMatrix *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
      std::allocator<sptk::SymmetricMatrix>::allocator((allocator<sptk::SymmetricMatrix> *)0x1322e4)
      ;
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
                (this_02,(size_type)this_00,
                 (value_type *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
      std::allocator<sptk::SymmetricMatrix>::~allocator
                ((allocator<sptk::SymmetricMatrix> *)0x13230c);
      SymmetricMatrix::~SymmetricMatrix
                ((SymmetricMatrix *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      for (iVar3 = 0; iVar3 < local_2c; iVar3 = iVar3 + 1) {
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                  (&local_48,(long)iVar3);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::operator[](local_20,(long)iVar3);
        in_stack_ffffffffffffff37 =
             SymmetricMatrix::SetDiagonal
                       (this_00,(vector<double,_std::allocator<double>_> *)
                                CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
        if (!(bool)in_stack_ffffffffffffff37) {
          local_1 = false;
          goto LAB_0013241d;
        }
      }
      local_1 = Run(in_stack_00000538,in_stack_00000530,in_stack_00000528,in_stack_00000520);
LAB_0013241d:
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector
                ((vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)
                 CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      goto LAB_0013242a;
    }
  }
  local_1 = false;
LAB_0013242a:
  return (bool)(local_1 & 1);
}

Assistant:

bool NonrecursiveMaximumLikelihoodParameterGeneration::Run(
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<std::vector<double> >& variance_vectors,
    std::vector<std::vector<double> >* smoothed_static_parameters) const {
  if (!is_valid_ || variance_vectors.empty()) {
    return false;
  }

  const int sequence_length(static_cast<int>(variance_vectors.size()));
  std::vector<SymmetricMatrix> covariance_matrices(
      sequence_length,
      SymmetricMatrix(static_cast<int>(variance_vectors[0].size())));
  for (int t(0); t < sequence_length; ++t) {
    if (!covariance_matrices[t].SetDiagonal(variance_vectors[t])) {
      return false;
    }
  }
  return Run(mean_vectors, covariance_matrices, smoothed_static_parameters);
}